

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<ProString_&,_const_char_(&)[7]>,_QString>,_const_char_(&)[3]>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  QConcatenable<QStringBuilder<QStringBuilder<ProString_&,_const_char_(&)[7]>,_QString>_>::
  appendTo<QChar>(&p->a,out);
  QConcatenable<const_char[3]>::appendTo(*p->b,out);
  return;
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }